

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ResolveExprNames(NameContext *pNC,Expr *pExpr)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  Parse *pParse;
  int iVar4;
  uint uVar5;
  Walker w;
  
  if (pExpr != (Expr *)0x0) {
    pParse = pNC->pParse;
    iVar4 = sqlite3ExprCheckHeight(pParse,pParse->nHeight + pExpr->nHeight);
    if (iVar4 == 0) {
      pParse->nHeight = pParse->nHeight + pExpr->nHeight;
      uVar2 = pNC->ncFlags;
      pNC->ncFlags = uVar2 & 0xefef;
      w.pParse = pNC->pParse;
      w.xExprCallback = resolveExprStep;
      w.xSelectCallback = resolveSelectStep;
      w.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      w.walkerDepth = 0;
      w.eCode = '\0';
      w.u.pNC = pNC;
      walkExpr(&w,pExpr);
      piVar1 = &pNC->pParse->nHeight;
      *piVar1 = *piVar1 - pExpr->nHeight;
      if ((0 < pNC->nErr) || (0 < (w.pParse)->nErr)) {
        *(byte *)&pExpr->flags = (byte)pExpr->flags | 8;
      }
      uVar3 = pNC->ncFlags;
      uVar5 = pExpr->flags;
      if ((uVar3 & 0x10) != 0) {
        uVar5 = uVar5 | 2;
        pExpr->flags = uVar5;
      }
      pNC->ncFlags = uVar2 & 0x1010 | uVar3;
      uVar5 = uVar5 >> 3 & 1;
    }
    else {
      uVar5 = 1;
    }
    return uVar5;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprNames( 
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  Expr *pExpr             /* The expression to be analyzed. */
){
  u16 savedHasAgg;
  Walker w;

  if( pExpr==0 ) return 0;
#if SQLITE_MAX_EXPR_DEPTH>0
  {
    Parse *pParse = pNC->pParse;
    if( sqlite3ExprCheckHeight(pParse, pExpr->nHeight+pNC->pParse->nHeight) ){
      return 1;
    }
    pParse->nHeight += pExpr->nHeight;
  }
#endif
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg);
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.walkerDepth = 0;
  w.eCode = 0;
  w.u.pNC = pNC;
  sqlite3WalkExpr(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
  pNC->pParse->nHeight -= pExpr->nHeight;
#endif
  if( pNC->nErr>0 || w.pParse->nErr>0 ){
    ExprSetProperty(pExpr, EP_Error);
  }
  if( pNC->ncFlags & NC_HasAgg ){
    ExprSetProperty(pExpr, EP_Agg);
  }
  pNC->ncFlags |= savedHasAgg;
  return ExprHasProperty(pExpr, EP_Error);
}